

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void op_addr_ri_post(DisasContext_conflict1 *s,arg_ldst_ri *a,TCGv_i32 addr,int address_offset)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx_00;
  TCGContext_conflict1 *tcg_ctx;
  int address_offset_local;
  TCGv_i32 addr_local;
  arg_ldst_ri *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->p == 0) {
    if (a->u == 0) {
      iVar1 = -a->imm;
    }
    else {
      iVar1 = a->imm;
    }
    tcg_ctx._4_4_ = iVar1 + address_offset;
  }
  else {
    tcg_ctx._4_4_ = address_offset;
    if (a->w == 0) {
      tcg_temp_free_i32(tcg_ctx_00,addr);
      return;
    }
  }
  tcg_gen_addi_i32_aarch64(tcg_ctx_00,addr,addr,tcg_ctx._4_4_);
  store_reg(s,a->rn,addr);
  return;
}

Assistant:

static void op_addr_ri_post(DisasContext *s, arg_ldst_ri *a,
                            TCGv_i32 addr, int address_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!a->p) {
        if (a->u) {
            address_offset += a->imm;
        } else {
            address_offset -= a->imm;
        }
    } else if (!a->w) {
        tcg_temp_free_i32(tcg_ctx, addr);
        return;
    }
    tcg_gen_addi_i32(tcg_ctx, addr, addr, address_offset);
    store_reg(s, a->rn, addr);
}